

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardMachine.hpp
# Opt level: O3

bool __thiscall
MachineTypes::KeyboardMachine::apply_key
          (KeyboardMachine *this,Key key,char symbol,bool is_pressed,bool is_repeat,
          bool map_logically)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  bool bVar6;
  undefined3 in_register_00000089;
  char string [2];
  char local_5a [2];
  KeyboardMachine *local_58;
  long *local_50 [2];
  long local_40 [2];
  long *plVar4;
  
  local_58 = this;
  iVar3 = (*(this->super_KeyActions)._vptr_KeyActions[5])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  local_5a[0] = symbol;
  if (CONCAT31(in_register_00000089,map_logically) != 0) {
    if ((is_pressed && symbol != '\0') &&
       (iVar3 = (*(local_58->super_KeyActions)._vptr_KeyActions[4])
                          (local_58,(ulong)(uint)(int)symbol), (char)iVar3 != '\0')) {
      local_5a[1] = 0;
      local_50[0] = local_40;
      sVar5 = strlen(local_5a);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_5a,local_5a + sVar5);
      (*(local_58->super_KeyActions)._vptr_KeyActions[3])(local_58,local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return true;
    }
    uVar2 = (**(code **)(*plVar4 + 0x10))(plVar4,key,(int)symbol,is_pressed,is_repeat);
    return (bool)uVar2;
  }
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,key,(int)symbol,is_pressed,is_repeat);
  bVar6 = true;
  if (cVar1 == '\0') {
    if ((is_pressed && symbol != '\0') &&
       (iVar3 = (*(local_58->super_KeyActions)._vptr_KeyActions[4])
                          (local_58,(ulong)(uint)(int)symbol), (char)iVar3 != '\0')) {
      local_5a[1] = 0;
      local_50[0] = local_40;
      sVar5 = strlen(local_5a);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_5a,local_5a + sVar5);
      (*(local_58->super_KeyActions)._vptr_KeyActions[3])(local_58,local_50);
      if (local_50[0] == local_40) {
        return true;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return true;
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool apply_key(Inputs::Keyboard::Key key, char symbol, bool is_pressed, bool is_repeat, bool map_logically) {
			Inputs::Keyboard &keyboard = get_keyboard();

			if(!map_logically) {
				// Try a regular keypress first, and stop if that works.
				if(keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat)) {
					return true;
				}

				// That having failed, if a symbol has been supplied then try typing it.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				return false;
			} else {
				// Try to type first.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				// That didn't work. Forward as a keypress. As, either:
				//	(i) this is a key down, but doesn't have a symbol, or is an untypeable symbol; or
				//	(ii) this is a key up, which it won't be an issue to miscommunicate.
				return keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat);
			}
		}